

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::fill(Forth *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint local_20;
  Cell i;
  CAddr caddr;
  uint length;
  Char ch;
  Forth *this_local;
  
  requireDStackDepth(this,3,"FILL");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
    dataSpaceSet(this,uVar3 + local_20,(Char)uVar1);
  }
  return;
}

Assistant:

void fill() {
			REQUIRE_DSTACK_DEPTH(3, "FILL");
			auto ch = static_cast<Char>(dStack.getTop()); pop();
			auto length = dStack.getTop(); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				dataSpaceSet(caddr + i, ch);
			}
		}